

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedPrimitive::GeneratePrivateMembers
          (RepeatedPrimitive *this,Printer *p)

{
  bool bVar1;
  char *pcVar2;
  FieldDescriptor *field;
  undefined8 uStack_120;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  Sub local_c8;
  
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    pcVar2 = "\n      $pbi$::RawPtr<$pb$::RepeatedField<$Type$>> $name$_;\n    ";
    uStack_120 = 0x3f;
  }
  else {
    pcVar2 = "\n      $pb$::RepeatedField<$Type$> $name$_;\n    ";
    uStack_120 = 0x30;
  }
  io::Printer::Emit(p,uStack_120,pcVar2);
  bVar1 = HasCachedSize(this);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"_cached_size_",&local_109);
    MakeVarintCachedSizeName_abi_cxx11_
              (&local_108,(cpp *)(this->super_FieldGeneratorBase).field_,field);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_c8,&local_e8,&local_108);
    google::protobuf::io::Printer::Emit
              (p,&local_c8,1,0x3e,"\n              $pbi$::CachedSize $_cached_size_$;\n            "
              );
    io::Printer::Sub::~Sub(&local_c8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return;
}

Assistant:

void RepeatedPrimitive::GeneratePrivateMembers(io::Printer* p) const {
  if (should_split()) {
    p->Emit(R"cc(
      $pbi$::RawPtr<$pb$::RepeatedField<$Type$>> $name$_;
    )cc");
  } else {
    p->Emit(R"cc(
      $pb$::RepeatedField<$Type$> $name$_;
    )cc");
  }

  if (HasCachedSize()) {
    p->Emit({{"_cached_size_", MakeVarintCachedSizeName(field_)}},
            R"cc(
              $pbi$::CachedSize $_cached_size_$;
            )cc");
  }
}